

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int fputc_wrapper(uchar outc,void *f)

{
  uint uVar1;
  int rc;
  FILE *s;
  int out;
  void *f_local;
  uchar outc_local;
  
  uVar1 = fputc((uint)outc,(FILE *)f);
  f_local._4_4_ = (uint)(uVar1 != outc);
  return f_local._4_4_;
}

Assistant:

static int fputc_wrapper(unsigned char outc, void *f)
{
  int out = outc;
  FILE *s = f;
  int rc = fputc(out, s);
  if(rc == out)
    return 0;
  return 1;
}